

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoreBroker.cpp
# Opt level: O0

void __thiscall helics::CoreBroker::transmitToParent(CoreBroker *this,ActionMessage *cmd)

{
  bool bVar1;
  undefined8 in_RSI;
  BrokerBase *in_RDI;
  ActionMessage *in_stack_ffffffffffffffd8;
  GlobalBrokerId local_14;
  undefined8 local_10;
  
  local_10 = in_RSI;
  bVar1 = isRoot((CoreBroker *)0x5e324d);
  if (bVar1) {
    BrokerBase::addActionMessage(in_RDI,in_stack_ffffffffffffffd8);
  }
  else {
    local_14 = CLI::std::atomic<helics::GlobalBrokerId>::load
                         ((atomic<helics::GlobalBrokerId> *)&in_RDI->higher_broker_id,seq_cst);
    bVar1 = GlobalBrokerId::isValid(&local_14);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      (*in_RDI->_vptr_BrokerBase[0x23])(in_RDI,0,local_10);
    }
    else {
      gmlc::containers::SimpleQueue<helics::ActionMessage,_std::mutex>::push<helics::ActionMessage>
                ((SimpleQueue<helics::ActionMessage,_std::mutex> *)this,cmd);
    }
  }
  return;
}

Assistant:

void CoreBroker::transmitToParent(ActionMessage&& cmd)
{
    if (isRoot()) {
        addActionMessage(std::move(cmd));
    } else {
        if (!global_id.load().isValid()) {
            delayTransmitQueue.push(std::move(cmd));
        } else {
            transmit(parent_route_id, std::move(cmd));
        }
    }
}